

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O2

bool __thiscall ON_Ellipse::Create(ON_Ellipse *this,ON_Plane *p,double rx,double ry)

{
  bool bVar1;
  long lVar2;
  ON_Ellipse *pOVar3;
  
  pOVar3 = this;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pOVar3->plane).origin.x = (p->origin).x;
    p = (ON_Plane *)&(p->origin).y;
    pOVar3 = (ON_Ellipse *)&(pOVar3->plane).origin.y;
  }
  this->radius[0] = rx;
  this->radius[1] = ry;
  bVar1 = IsValid(this);
  return bVar1;
}

Assistant:

bool ON_Ellipse::Create( const ON_Plane& p, double rx, double ry )
{
  plane = p;
  radius[0] = rx;
  radius[1] = ry;
  return IsValid();
}